

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_V_Test::~PhPacker_Arg_V_Test(PhPacker_Arg_V_Test *this)

{
  PhPacker_Arg_V_Test *this_local;
  
  ~PhPacker_Arg_V_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_V)
{
   std::string str = PhPacker::pack<uint32_t>('V', 655351234);
   unsigned long result = std::any_cast<uint32_t>(PhPacker::unpack('V', str));
   unsigned long expected = 655351234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('V', 65);
   result = std::any_cast<uint32_t>(PhPacker::unpack('V', str));
   expected = 65;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('V', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('V', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);


   str = PhPacker::pack<uint32_t>('V', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('V', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}